

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.h
# Opt level: O2

bool __thiscall PropertyDef::stdCppSet(PropertyDef *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->name).d.size == 0) {
    bVar1 = false;
  }
  else {
    local_48.size = -0x5555555555555556;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_48,"set",-1);
    QByteArray::append((char)&local_48);
    QByteArray::mid((longlong)&local_60,(longlong)this);
    QByteArray::append((QByteArray *)&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    bVar1 = operator==((QByteArray *)&local_48,&this->write);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool stdCppSet() const {
        if (name.isEmpty())
            return false;
        QByteArray s("set");
        s += QtMiscUtils::toAsciiUpper(name[0]);
        s += name.mid(1);
        return (s == write);
    }